

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

Vec_Ptr_t * Gia_ManDeriveDivs(Vec_Wrd_t *vSims,int nWords)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar1 = (long)vSims->nSize / (long)nWords;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < (int)uVar1 - 1U) {
    uVar8 = uVar1 & 0xffffffff;
  }
  pVVar2->nSize = 0;
  iVar7 = (int)uVar8;
  pVVar2->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar2->pArray = ppvVar3;
  if (0 < (int)uVar1) {
    lVar6 = (long)nWords;
    lVar5 = 0;
    lVar10 = 0;
    uVar9 = 0;
    do {
      if ((lVar5 < 0) || (lVar5 = lVar5 + lVar6, (long)vSims->nSize <= lVar5 - lVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pvVar4 = (void *)((long)vSims->pArray + lVar10);
      iVar7 = (int)uVar8;
      if ((int)uVar9 == iVar7) {
        if (iVar7 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar8 = 0x10;
        }
        else {
          uVar8 = (ulong)(uint)(iVar7 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar8 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar8 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar7 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      lVar10 = lVar10 + lVar6 * 8;
      pVVar2->nSize = (int)uVar9 + 1;
      ppvVar3[uVar9] = pvVar4;
      uVar9 = uVar9 + 1;
    } while ((uVar1 & 0xffffffff) != uVar9);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Gia_ManDeriveDivs( Vec_Wrd_t * vSims, int nWords )
{
    int i, nDivs = Vec_WrdSize(vSims)/nWords;
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( nDivs );
    for ( i = 0; i < nDivs; i++ )
        Vec_PtrPush( vDivs, Vec_WrdEntryP(vSims, nWords*i) );
    return vDivs;
}